

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

void test_all<unsigned_char,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>)>>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *to_bench,size_t attempts,
               function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
               *statistic,
               function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
               *prepare)

{
  allocator<unsigned_char> *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
  __l;
  function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
  *name_00;
  bool bVar1;
  size_type __n;
  pointer ppVar2;
  error *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  *local_7f8;
  string local_780;
  undefined1 local_760 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_message;
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  local_720;
  function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
  local_700;
  function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
  *local_6e0;
  function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
  *call;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_true>
  local_6c8;
  iterator call_params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sort_call_title;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_698;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_658;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_618;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_5d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_598;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_558;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_518;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_4d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  local_498;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  *local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  local_150;
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
  sort_calls;
  anon_class_1_0_00000001 boost_spreadsort;
  anon_class_1_0_00000001 std_stable_sort;
  anon_class_8_1_4eff857e aStack_a0;
  anon_class_1_0_00000001 std_sort;
  anon_class_8_1_4eff857e radix_sort_par_16;
  anon_class_8_1_4eff857e radix_sort_par_8;
  anon_class_8_1_4eff857e radix_sort_par_4;
  anon_class_8_1_4eff857e radix_sort_par_2;
  anon_class_8_1_4eff857e radix_sort_par_max;
  anon_class_8_1_4eff857e radix_sort;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> numbers;
  function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
  *prepare_local;
  function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
  *statistic_local;
  size_t attempts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *to_bench_local;
  
  numbers.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)prepare;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  utility::read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((istream *)&std::cin,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40)
  ;
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  this = (allocator<unsigned_char> *)((long)&radix_sort.buffer + 7);
  std::allocator<unsigned_char>::allocator(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,__n,this);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&radix_sort.buffer + 7));
  aStack_a0.buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68;
  __range1._7_1_ = 1;
  local_458 = &local_450;
  radix_sort_par_16.buffer = aStack_a0.buffer;
  radix_sort_par_8.buffer = aStack_a0.buffer;
  radix_sort_par_4.buffer = aStack_a0.buffer;
  radix_sort_par_2.buffer = aStack_a0.buffer;
  radix_sort_par_max.buffer = aStack_a0.buffer;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:99:9)_&,_true>
            (&local_498,&burst_radix_sort_call_name_abi_cxx11_,&radix_sort_par_max);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_450,&burst_radix_sort_title_abi_cxx11_,&local_498);
  local_458 = &local_3f0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:104:9)_&,_true>
            (&local_4d8,&burst_radix_sort_par_max_call_name_abi_cxx11_,&radix_sort_par_2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_3f0,&burst_radix_sort_par_max_title_abi_cxx11_,&local_4d8);
  local_458 = &local_390;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:110:9)_&,_true>
            (&local_518,&burst_radix_sort_par_2_call_name_abi_cxx11_,&radix_sort_par_4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_390,&burst_radix_sort_par_2_title_abi_cxx11_,&local_518);
  local_458 = &local_330;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:115:9)_&,_true>
            (&local_558,&burst_radix_sort_par_4_call_name_abi_cxx11_,&radix_sort_par_8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_330,&burst_radix_sort_par_4_title_abi_cxx11_,&local_558);
  local_458 = &local_2d0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:120:9)_&,_true>
            (&local_598,&burst_radix_sort_par_8_call_name_abi_cxx11_,&radix_sort_par_16);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_2d0,&burst_radix_sort_par_8_title_abi_cxx11_,&local_598);
  local_458 = &local_270;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:125:9)_&,_true>
            (&local_5d8,&burst_radix_sort_par_16_call_name_abi_cxx11_,&stack0xffffffffffffff60);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_270,&burst_radix_sort_par_16_title_abi_cxx11_,&local_5d8);
  local_458 = &local_210;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:130:9)_&,_true>
            (&local_618,&std_sort_call_name_abi_cxx11_,
             (anon_class_1_0_00000001 *)((long)&sort_calls._M_h._M_single_bucket + 7));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_210,&std_sort_title_abi_cxx11_,&local_618);
  local_458 = &local_1b0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:135:9)_&,_true>
            (&local_658,&std_stable_sort_call_name_abi_cxx11_,
             (anon_class_1_0_00000001 *)((long)&sort_calls._M_h._M_single_bucket + 6));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_1b0,&std_stable_sort_title_abi_cxx11_,&local_658);
  local_458 = &local_150;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::
  pair<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_benchmark_burst_algorithm_radix_sort_cpp:140:9)_&,_true>
            (&local_698,&boost_spreadsort_call_name_abi_cxx11_,
             (anon_class_1_0_00000001 *)((long)&sort_calls._M_h._M_single_bucket + 5));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_true>
            (&local_150,&boost_spreadsort_title_abi_cxx11_,&local_698);
  __range1._7_1_ = 0;
  local_f0 = &local_450;
  local_e8 = 9;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
               *)((long)&__range1 + 4));
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
                   *)local_e0,__l,0,(hasher *)((long)&__range1 + 6),
                  (key_equal *)((long)&__range1 + 5),
                  (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                   *)((long)&__range1 + 4));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>
                *)((long)&__range1 + 4));
  local_7f8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
               *)&local_f0;
  do {
    local_7f8 = local_7f8 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>
    ::~pair(local_7f8);
  } while (local_7f8 != &local_450);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_698);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_658);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_618);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_5d8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_598);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_558);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_518);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_4d8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>
  ::~pair(&local_498);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(to_bench);
  sort_call_title =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(to_bench);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&sort_call_title);
    if (!bVar1) {
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
                        *)local_e0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      return;
    }
    call_params.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_true>
               )__gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    local_6c8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
                 *)local_e0,
                (key_type *)
                call_params.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_true>
                ._M_cur);
    name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>_>_>
                  *)local_e0);
    bVar1 = std::__detail::operator!=
                      (&local_6c8,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_true>
                        *)&name);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_false,_true>
                           *)&local_6c8);
    call = (function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
            *)&ppVar2->second;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_false,_true>
                           *)&local_6c8);
    name_00 = call;
    local_6e0 = &(ppVar2->second).second;
    std::
    function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
    ::function(&local_700,local_6e0);
    std::
    function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
    ::function(&local_720,statistic);
    std::
    function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
    ::function((function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
                *)((long)&error_message.field_2 + 8),prepare);
    test_sort<std::function<void(__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>)>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::function<std::chrono::duration<long,std::ratio<1l,1000000000l>>(std::vector<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000000l>>>>)>,std::function<std::vector<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>)>>
              ((string *)name_00,&local_700,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,attempts,&local_720
               ,(function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
                 *)((long)&error_message.field_2 + 8));
    std::
    function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
    ::~function((function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_(std::vector<unsigned_char,_std::allocator<unsigned_char>_>)>
                 *)((long)&error_message.field_2 + 8));
    std::
    function<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_(std::vector<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>)>
    ::~function(&local_720);
    std::
    function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>
    ::~function(&local_700);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  burst::literals::operator____u8s_abi_cxx11_(&local_780,anon_var_dwarf_caa39,0x45);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760,
                 &local_780,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 call_params.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)>_>_>,_true>
                 ._M_cur);
  std::__cxx11::string::~string((string *)&local_780);
  this_00 = (error *)__cxa_allocate_exception(0x10);
  boost::program_options::error::error(this_00,(string *)local_760);
  __cxa_throw(this_00,&boost::program_options::error::typeinfo,boost::program_options::error::~error
             );
}

Assistant:

void
    test_all
    (
        const std::vector<std::string> & to_bench,
        std::size_t attempts,
        UnaryFunction1 statistic,
        UnaryFunction2 prepare
    )
{
    std::vector<Value> numbers;
    utility::read(std::cin, numbers);

    std::vector<Value> buffer(numbers.size());

    auto radix_sort =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_max =
        [& buffer] (auto && ... args)
        {
            const auto par = burst::par(std::max(std::thread::hardware_concurrency(), 2u));
            return burst::radix_sort(par, std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_2 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(2), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_4 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(4), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_8 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(8), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto radix_sort_par_16 =
        [& buffer] (auto && ... args)
        {
            return burst::radix_sort(burst::par(16), std::forward<decltype(args)>(args)..., buffer.begin(), burst::to_ordered_integral);
        };
    auto std_sort =
        [] (auto && ... args)
        {
            return std::sort(std::forward<decltype(args)>(args)...);
        };
    auto std_stable_sort =
        [] (auto && ... args)
        {
            return std::stable_sort(std::forward<decltype(args)>(args)...);
        };
    auto boost_spreadsort =
        [] (auto && ... args)
        {
            return boost::sort::spreadsort::spreadsort(std::forward<decltype(args)>(args)...);
        };

    using iterator_type = typename std::vector<Value>::iterator;
    using sort_call_type = std::function<void(iterator_type, iterator_type)>;
    auto sort_calls =
        std::unordered_map<std::string, std::pair<std::string, sort_call_type>>
        {
            {burst_radix_sort_title, {burst_radix_sort_call_name, radix_sort}},
            {burst_radix_sort_par_max_title, {burst_radix_sort_par_max_call_name, radix_sort_par_max}},
            {burst_radix_sort_par_2_title, {burst_radix_sort_par_2_call_name, radix_sort_par_2}},
            {burst_radix_sort_par_4_title, {burst_radix_sort_par_4_call_name, radix_sort_par_4}},
            {burst_radix_sort_par_8_title, {burst_radix_sort_par_8_call_name, radix_sort_par_8}},
            {burst_radix_sort_par_16_title, {burst_radix_sort_par_16_call_name, radix_sort_par_16}},
            {std_sort_title, {std_sort_call_name, std_sort}},
            {std_stable_sort_title, {std_stable_sort_call_name, std_stable_sort}},
            {boost_spreadsort_title, {boost_spreadsort_call_name, boost_spreadsort}}
        };

    for (const auto & sort_call_title: to_bench)
    {
        auto call_params = sort_calls.find(sort_call_title);
        if (call_params != sort_calls.end())
        {
            const auto & name = call_params->second.first;
            const auto & call = call_params->second.second;
            test_sort(name, call, numbers, attempts, statistic, prepare);
        }
        else
        {
            const auto error_message =
                u8"Неверный тип тестируемого алгоритма: "_u8s + sort_call_title;
            throw boost::program_options::error(error_message);
        }
    }
}